

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result_opt * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::prior(iter_result_opt *__return_storage_ptr__,
       basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,uint8_t child_index)

{
  key_prefix_snapshot kVar1;
  undefined8 in_RAX;
  uintptr_t uVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  undefined4 local_26;
  undefined2 local_22;
  
  uVar3 = (ulong)CONCAT31(in_register_00000011,child_index);
  do {
    if ((long)uVar3 < 1) {
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_payload._M_value.prefix.u64 = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_engaged = 0;
      return __return_storage_ptr__;
    }
    uVar3 = uVar3 - 1;
  } while ((this->child_indexes)._M_elems[uVar3 & 0xff].value.super___atomic_base<unsigned_char>.
           _M_i == 0xff);
  uVar2 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr((olc_node_header *)this,I48);
  kVar1 = *(key_prefix_snapshot *)&this->field_0x18;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar2;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.key_byte = (byte)uVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.child_index = (byte)uVar3;
  local_26 = (undefined4)((ulong)in_RAX >> 0x10);
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 10) = local_26;
  local_22 = (undefined2)((ulong)in_RAX >> 0x30);
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 0xe) = local_22;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.prefix = kVar1;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result_opt
  prior(std::uint8_t child_index) noexcept {
    // loop over the prior byte values in lexical order.
    for (auto i = static_cast<std::int64_t>(child_index) - 1; i >= 0; i--) {
      if (child_indexes[static_cast<std::uint8_t>(i)] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto next_index = static_cast<std::uint8_t>(i);
        return {{node_ptr{this, node_type::I48}, key, next_index,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    return parent_class::end_result;
  }